

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

N_Vector N_VNew_SensWrapper(int count,N_Vector w)

{
  N_Vector w_00;
  N_Vector p_Var1;
  long in_RSI;
  undefined4 in_EDI;
  int i;
  N_Vector v;
  int local_24;
  undefined4 in_stack_fffffffffffffff0;
  undefined8 in_stack_fffffffffffffff8;
  
  w_00 = N_VNewEmpty_SensWrapper
                   ((int)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                    (SUNContext)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  if (w_00 == (N_Vector)0x0) {
    w_00 = (N_Vector)0x0;
  }
  else {
    for (local_24 = 0; local_24 < *(int *)((long)w_00->content + 8); local_24 = local_24 + 1) {
      p_Var1 = N_VClone(w_00);
      *(N_Vector *)(*w_00->content + (long)local_24 * 8) = p_Var1;
      if (*(long *)(*w_00->content + (long)local_24 * 8) == 0) {
        N_VDestroy((N_Vector)0x1106be);
        return (N_Vector)0x0;
      }
    }
    *(undefined4 *)((long)w_00->content + 0xc) = 1;
    w_00->sunctx = *(SUNContext *)(in_RSI + 0x10);
  }
  return w_00;
}

Assistant:

N_Vector N_VNew_SensWrapper(int count, N_Vector w)
{
  N_Vector v;
  int i;

  v = NULL;
  v = N_VNewEmpty_SensWrapper(count, w->sunctx);
  if (v == NULL) { return (NULL); }

  for (i = 0; i < NV_NVECS_SW(v); i++)
  {
    NV_VEC_SW(v, i) = N_VClone(w);
    if (NV_VEC_SW(v, i) == NULL)
    {
      N_VDestroy(v);
      return (NULL);
    }
  }

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  /* set context */
  v->sunctx = w->sunctx;

  return (v);
}